

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_common.cpp
# Opt level: O0

void __thiscall cfd::SignParameter::SignParameter(SignParameter *this,SignParameter *sign_parameter)

{
  bool bVar1;
  SignDataType SVar2;
  SignParameter *in_RSI;
  ByteData *in_RDI;
  SignParameter *in_stack_ffffffffffffff28;
  ByteData *in_stack_ffffffffffffff30;
  ScriptOperator local_90;
  SigHashType local_5c [12];
  Pubkey local_50 [2];
  SignParameter *local_10;
  
  local_10 = in_RSI;
  cfd::core::ByteData::ByteData(in_RDI);
  cfd::core::Pubkey::Pubkey
            ((Pubkey *)
             &in_RDI[1].data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  cfd::core::SigHashType::SigHashType
            ((SigHashType *)
             ((long)&in_RDI[2].data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish + 4));
  core::ScriptOperator::ScriptOperator((ScriptOperator *)(in_RDI + 3));
  GetData(in_stack_ffffffffffffff28);
  core::ByteData::operator=(in_stack_ffffffffffffff30,&in_stack_ffffffffffffff28->data_);
  core::ByteData::~ByteData((ByteData *)0x394e93);
  SVar2 = GetDataType(local_10);
  *(SignDataType *)
   &in_RDI[1].data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = SVar2;
  GetRelatedPubkey(in_stack_ffffffffffffff28);
  core::Pubkey::operator=(local_50,(Pubkey *)in_stack_ffffffffffffff28);
  core::Pubkey::~Pubkey((Pubkey *)0x394eee);
  bVar1 = IsDerEncode(local_10);
  *(bool *)&in_RDI[2].data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish = bVar1;
  GetSigHashType(in_stack_ffffffffffffff28);
  cfd::core::SigHashType::operator=
            ((SigHashType *)
             ((long)&in_RDI[2].data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish + 4),local_5c);
  GetOpCode(in_stack_ffffffffffffff28);
  cfd::core::ScriptOperator::operator=((ScriptOperator *)(in_RDI + 3),&local_90);
  core::ScriptOperator::~ScriptOperator((ScriptOperator *)0x394f6c);
  return;
}

Assistant:

SignParameter::SignParameter(const SignParameter& sign_parameter) {
  data_ = sign_parameter.GetData();
  data_type_ = sign_parameter.GetDataType();
  related_pubkey_ = sign_parameter.GetRelatedPubkey();
  der_encode_ = sign_parameter.IsDerEncode();
  sighash_type_ = sign_parameter.GetSigHashType();
  op_code_ = sign_parameter.GetOpCode();
}